

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES>
::test_shader_compilation
          (ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  undefined8 uVar1;
  bool bVar2;
  pointer ppVar3;
  TestError *pTVar4;
  undefined1 *local_408;
  string *fs_1;
  string *gs_1;
  string *tes_1;
  string *tcs_1;
  string *vs_1;
  string *cs_1;
  undefined1 local_3b8 [8];
  string shader_source_1;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  string base_variable_string_1;
  string local_288 [8];
  string outer_separator;
  size_t max_dimension_index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator<char> local_1d9;
  undefined1 local_1d8 [8];
  string base_structure;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_1b0;
  iterator local_1a8;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_1a0;
  _supported_variable_types_map_const_iterator var_iterator_1;
  undefined1 *puStack_190;
  int var_type_index_1;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string shader_source;
  string local_120;
  string local_100;
  allocator<char> local_d9;
  string local_d8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string base_variable_string;
  size_t max_dimension_index;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_28;
  _supported_variable_types_map_const_iterator var_iterator;
  int var_type_index;
  int num_var_types;
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  var_iterator._M_node._4_4_ = 0;
  while( true ) {
    if (0x1b < var_iterator._M_node._4_4_) {
      var_iterator_1._M_node._4_4_ = 0;
      while( true ) {
        if (0x1b < var_iterator_1._M_node._4_4_) {
          return;
        }
        local_1a8._M_node =
             (_Base_ptr)
             std::
             map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
             ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                     *)supported_variable_types_map,
                    (key_type *)(Interface::ES::var_types + (long)var_iterator_1._M_node._4_4_ * 4))
        ;
        std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
        ::_Rb_tree_const_iterator(&local_1a0,&local_1a8);
        base_structure.field_2._8_8_ =
             std::
             map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
             ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                    *)supported_variable_types_map);
        std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
        ::_Rb_tree_const_iterator(&local_1b0,(iterator *)((long)&base_structure.field_2 + 8));
        bVar2 = std::operator!=(&local_1a0,&local_1b0);
        if (!bVar2) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1d8,"struct my_structure\n",&local_1d9);
        std::allocator<char>::~allocator(&local_1d9);
        std::__cxx11::string::operator+=((string *)local_1d8,"{\n");
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                 ::operator->(&local_1a0);
        std::operator+(&local_220,"    ",&(ppVar3->second).type);
        std::operator+(&local_200,&local_220," b;\n");
        std::__cxx11::string::operator+=((string *)local_1d8,(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                 ::operator->(&local_1a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &max_dimension_index_1,"    ",&(ppVar3->second).type);
        std::operator+(&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &max_dimension_index_1," c;\n");
        std::__cxx11::string::operator+=((string *)local_1d8,(string *)&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&max_dimension_index_1);
        std::__cxx11::string::operator+=((string *)local_1d8,"};\n\n");
        for (outer_separator.field_2._8_8_ = 1; (ulong)outer_separator.field_2._8_8_ < 8;
            outer_separator.field_2._8_8_ = outer_separator.field_2._8_8_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_288,"(",
                     (allocator<char> *)(base_variable_string_1.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(base_variable_string_1.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string((string *)local_2b0);
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                   ::operator->(&local_1a0);
          std::operator+(&local_310,"    ",&(ppVar3->second).type);
          std::operator+(&local_2f0,&local_310," a");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_330,"[2]",&local_331);
          (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
            super_TestNode._vptr_TestNode[6])
                    (local_2d0,this,&local_2f0,local_330,outer_separator.field_2._8_8_);
          std::__cxx11::string::operator+=((string *)local_2b0,local_2d0);
          std::__cxx11::string::~string(local_2d0);
          std::__cxx11::string::~string(local_330);
          std::allocator<char>::~allocator(&local_331);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::operator+=((string *)local_2b0," = ");
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                   ::operator->(&local_1a0);
          std::__cxx11::string::string((string *)&local_378,(string *)&ppVar3->second);
          uVar1 = outer_separator.field_2._8_8_;
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                   ::operator->(&local_1a0);
          std::__cxx11::string::string
                    ((string *)(shader_source_1.field_2._M_local_buf + 8),
                     (string *)&(ppVar3->second).initializer_with_ones);
          recursively_initialise
                    (&local_358,this,&local_378,uVar1,(string *)((long)&shader_source_1.field_2 + 8)
                    );
          std::__cxx11::string::operator+=((string *)local_2b0,(string *)&local_358);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)(shader_source_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::operator+=((string *)local_2b0,";\n\n");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         shader_start_abi_cxx11_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0);
          std::__cxx11::string::~string((string *)&cs_1);
          switch(tested_shader_type) {
          case FRAGMENT_SHADER_TYPE:
            break;
          case VERTEX_SHADER_TYPE:
            std::__cxx11::string::operator+=((string *)local_3b8,"\n\tgl_Position = vec4(0.0);\n");
            break;
          case COMPUTE_SHADER_TYPE:
            break;
          case GEOMETRY_SHADER_TYPE:
            std::__cxx11::string::operator+=((string *)local_3b8,(string *)emit_quad_abi_cxx11_);
            break;
          case TESSELATION_CONTROL_SHADER_TYPE:
            std::__cxx11::string::operator+=
                      ((string *)local_3b8,(string *)set_tesseation_abi_cxx11_);
            break;
          case TESSELATION_EVALUATION_SHADER_TYPE:
            break;
          default:
            pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar4,"Unrecognized shader type.",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                       ,0x7f6);
            __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          std::__cxx11::string::operator+=((string *)local_3b8,(string *)shader_end_abi_cxx11_);
          tcs_1 = (string *)default_vertex_shader_source_abi_cxx11_;
          local_408 = default_fragment_shader_source_abi_cxx11_;
          switch(tested_shader_type) {
          case FRAGMENT_SHADER_TYPE:
            local_408 = local_3b8;
            break;
          case VERTEX_SHADER_TYPE:
            tcs_1 = (string *)local_3b8;
            break;
          case COMPUTE_SHADER_TYPE:
            tcs_1 = (string *)empty_string_abi_cxx11_;
            local_408 = empty_string_abi_cxx11_;
            break;
          case GEOMETRY_SHADER_TYPE:
            break;
          case TESSELATION_CONTROL_SHADER_TYPE:
            break;
          case TESSELATION_EVALUATION_SHADER_TYPE:
            break;
          default:
            pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar4,"Invalid enum",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                       ,0x7f9);
            __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
            super_TestNode._vptr_TestNode[9])(this,tcs_1,local_408,1,0);
          std::__cxx11::string::~string((string *)local_3b8);
          std::__cxx11::string::~string((string *)local_2b0);
          std::__cxx11::string::~string(local_288);
        }
        std::__cxx11::string::~string((string *)local_1d8);
        var_iterator_1._M_node._4_4_ = var_iterator_1._M_node._4_4_ + 1;
      }
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x7fe);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_30._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                (key_type *)(Interface::ES::var_types + (long)var_iterator._M_node._4_4_ * 4));
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_28,&local_30);
    max_dimension_index =
         (size_t)std::
                 map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                        *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_38,(iterator *)&max_dimension_index);
    bVar2 = std::operator!=(&local_28,&local_38);
    if (!bVar2) break;
    for (base_variable_string.field_2._8_8_ = 2; (ulong)base_variable_string.field_2._8_8_ < 8;
        base_variable_string.field_2._8_8_ = base_variable_string.field_2._8_8_ + 1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_28);
      std::operator+(&local_a8,"    ",&(ppVar3->second).type);
      std::operator+(&local_88,&local_a8," a");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d8,"[]",&local_d9);
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
        super_TestNode._vptr_TestNode[6])
                (local_68,this,&local_88,local_d8,base_variable_string.field_2._8_8_);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::operator+=((string *)local_68," = ");
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_28);
      std::__cxx11::string::string((string *)&local_120,(string *)&ppVar3->second);
      uVar1 = base_variable_string.field_2._8_8_;
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_28);
      std::__cxx11::string::string
                ((string *)(shader_source.field_2._M_local_buf + 8),
                 (string *)&(ppVar3->second).initializer_with_ones);
      recursively_initialise
                (&local_100,this,&local_120,uVar1,(string *)((long)&shader_source.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_68,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)(shader_source.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::operator+=((string *)local_68,";\n\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     shader_start_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
        break;
      case VERTEX_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)&cs,"\n\tgl_Position = vec4(0.0);\n");
        break;
      case COMPUTE_SHADER_TYPE:
        break;
      case GEOMETRY_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)&cs,(string *)emit_quad_abi_cxx11_);
        break;
      case TESSELATION_CONTROL_SHADER_TYPE:
        std::__cxx11::string::operator+=((string *)&cs,(string *)set_tesseation_abi_cxx11_);
        break;
      case TESSELATION_EVALUATION_SHADER_TYPE:
        break;
      default:
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x7cd);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=((string *)&cs,(string *)shader_end_abi_cxx11_);
      tcs = (string *)default_vertex_shader_source_abi_cxx11_;
      puStack_190 = default_fragment_shader_source_abi_cxx11_;
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
        puStack_190 = (undefined1 *)&cs;
        break;
      case VERTEX_SHADER_TYPE:
        tcs = (string *)&cs;
        break;
      case COMPUTE_SHADER_TYPE:
        tcs = (string *)empty_string_abi_cxx11_;
        puStack_190 = empty_string_abi_cxx11_;
        break;
      case GEOMETRY_SHADER_TYPE:
        break;
      case TESSELATION_CONTROL_SHADER_TYPE:
        break;
      case TESSELATION_EVALUATION_SHADER_TYPE:
        break;
      default:
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,2000);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
        super_TestNode._vptr_TestNode[9])(this,tcs,puStack_190,1,0);
      std::__cxx11::string::~string((string *)&cs);
      std::__cxx11::string::~string((string *)local_68);
    }
    var_iterator._M_node._4_4_ = var_iterator._M_node._4_4_ + 1;
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x7d5);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ConstructorsAndUnsizedDeclConstructors1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	//vec4 color = vec4(0.0, 1.0, 0.0, 1.0);
	int num_var_types = API::n_var_types;

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t max_dimension_index = 2; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
			{
				std::string base_variable_string =
					this->extend_string("    " + var_iterator->second.type + " a", "[]", max_dimension_index);

				base_variable_string += " = ";
				base_variable_string += recursively_initialise(var_iterator->second.type, max_dimension_index,
															   var_iterator->second.initializer_with_ones);
				base_variable_string += ";\n\n";

				std::string shader_source = shader_start + base_variable_string;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			} /* for (int max_dimension_index = 1; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_structure = "struct my_structure\n";

			base_structure += "{\n";
			base_structure += "    " + var_iterator->second.type + " b;\n";
			base_structure += "    " + var_iterator->second.type + " c;\n";
			base_structure += "};\n\n";

			for (size_t max_dimension_index = 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
			{
				std::string outer_separator = "(";
				std::string base_variable_string;

				base_variable_string +=
					this->extend_string("    " + var_iterator->second.type + " a", "[2]", max_dimension_index);
				base_variable_string += " = ";
				base_variable_string += recursively_initialise(var_iterator->second.type, max_dimension_index,
															   var_iterator->second.initializer_with_ones);
				base_variable_string += ";\n\n";

				std::string shader_source = base_structure + shader_start + base_variable_string;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			} /* for (int max_dimension_index = 1; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}